

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

void igTextColored(ImVec4 col,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  ImVec4 local_e8;
  __va_list_tag local_d8;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.reg_save_area = local_b8;
  local_d8.overflow_arg_area = &stack0x00000008;
  local_d8.gp_offset = 8;
  local_d8.fp_offset = 0x50;
  local_b0 = in_RSI;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  ImGui::TextColoredV(&local_e8,fmt,&local_d8);
  return;
}

Assistant:

CIMGUI_API void _igTextColored (ImVec4 const *larg1, char *larg2) {
  ImVec4 arg1 ;
  char *arg2 = (char *) 0 ;
  void *arg3 = 0 ;
  
  arg1 = *larg1;
  arg2 = larg2;
  try {
    igTextColored(arg1,(char const *)arg2,arg3);
    
  } catch (...) {
    
  }
}